

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpExtraHeaders.c
# Opt level: O0

int UpnpExtraHeaders_set_resp(UpnpExtraHeaders *p,char *s)

{
  char *pcVar1;
  char *q;
  char *s_local;
  UpnpExtraHeaders *p_local;
  
  pcVar1 = ixmlCloneDOMString(s);
  if (pcVar1 != (char *)0x0) {
    ixmlFreeDOMString(p->m_resp);
    p->m_resp = pcVar1;
  }
  p_local._4_4_ = (uint)(pcVar1 != (char *)0x0);
  return p_local._4_4_;
}

Assistant:

int UpnpExtraHeaders_set_resp(UpnpExtraHeaders *p, const DOMString s)
{
	DOMString q = ixmlCloneDOMString(s);
	if (!q)
		return 0;
	ixmlFreeDOMString(p->m_resp);
	p->m_resp = q;

	return 1;
}